

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O2

bool google::glog_internal_namespace_::SafeFNMatch_
               (char *pattern,size_t patt_len,char *str,size_t str_len)

{
  char cVar1;
  bool bVar2;
  char *str_00;
  ulong uVar3;
  size_t str_len_00;
  bool bVar4;
  
  uVar3 = 0;
  while( true ) {
    if (patt_len == uVar3) {
      return str_len == uVar3;
    }
    if (str_len - uVar3 == 0) {
      if (str_len + 1 != patt_len) {
        return false;
      }
      return pattern[str_len] == '*';
    }
    cVar1 = pattern[uVar3];
    if ((cVar1 != '?') && (cVar1 != str[uVar3])) break;
    uVar3 = uVar3 + 1;
  }
  if (cVar1 != '*') {
    return false;
  }
  if (patt_len - 1 != uVar3) {
    str_00 = str + uVar3;
    str_len_00 = str_len - uVar3;
    do {
      bVar2 = SafeFNMatch_(pattern + uVar3 + 1,~uVar3 + patt_len,str_00,str_len_00);
      if (bVar2) {
        return bVar2;
      }
      str_00 = str_00 + 1;
      bVar4 = str_len_00 != 1;
      str_len_00 = str_len_00 - 1;
    } while (bVar4);
    return bVar2;
  }
  return true;
}

Assistant:

GOOGLE_GLOG_DLL_DECL bool SafeFNMatch_(const char* pattern,
                                       size_t patt_len,
                                       const char* str,
                                       size_t str_len) {
  size_t p = 0;
  size_t s = 0;
  while (1) {
    if (p == patt_len  &&  s == str_len) return true;
    if (p == patt_len) return false;
    if (s == str_len) return p+1 == patt_len  &&  pattern[p] == '*';
    if (pattern[p] == str[s]  ||  pattern[p] == '?') {
      p += 1;
      s += 1;
      continue;
    }
    if (pattern[p] == '*') {
      if (p+1 == patt_len) return true;
      do {
        if (SafeFNMatch_(pattern+(p+1), patt_len-(p+1), str+s, str_len-s)) {
          return true;
        }
        s += 1;
      } while (s != str_len);
      return false;
    }
    return false;
  }
}